

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenDefaultBufferValue_abi_cxx11_
          (string *__return_storage_ptr__,KotlinKMPGenerator *this,FieldDef *field)

{
  BaseType t;
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  Type *type;
  Type local_a8;
  allocator<char> local_86;
  undefined1 local_85;
  undefined4 local_84;
  allocator<char> local_7f;
  byte local_7e;
  allocator<char> local_7d [13];
  undefined1 local_70 [8];
  string suffix;
  string field_name;
  BaseType base_type;
  Value *value;
  FieldDef *field_local;
  KotlinKMPGenerator *this_local;
  string *val;
  
  t = (field->value).type.base_type;
  std::__cxx11::string::string((string *)(suffix.field_2._M_local_buf + 8),(string *)field);
  bVar1 = IsScalar(t);
  local_7e = 0;
  if (bVar1) {
    LiteralSuffix_abi_cxx11_((string *)local_70,(KotlinKMPGenerator *)&field->value,type);
  }
  else {
    std::allocator<char>::allocator();
    local_7e = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"",local_7d);
  }
  if ((local_7e & 1) != 0) {
    std::allocator<char>::~allocator(local_7d);
  }
  bVar1 = FieldDef::IsScalarOptional(field);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"null",&local_7f);
    std::allocator<char>::~allocator(&local_7f);
  }
  else {
    bVar1 = IsFloat(t);
    if (bVar1) {
      local_85 = 0;
      FloatConstantGenerator::GenFloatConstant_abi_cxx11_
                (__return_storage_ptr__,
                 (FloatConstantGenerator *)(anonymous_namespace)::KotlinFloatGen,field);
      if ((t == BASE_TYPE_DOUBLE) && (pcVar3 = (char *)std::__cxx11::string::back(), *pcVar3 == 'f')
         ) {
        std::__cxx11::string::pop_back();
      }
      local_85 = 1;
    }
    else if (t == BASE_TYPE_BOOL) {
      bVar1 = std::operator==(&(field->value).constant,"0");
      pcVar3 = "true";
      if (bVar1) {
        pcVar3 = "false";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,pcVar3,&local_86);
      std::allocator<char>::~allocator(&local_86);
    }
    else {
      bVar1 = IsEnum(&(field->value).type);
      if (bVar1) {
        std::operator+(__return_storage_ptr__,&(field->value).constant,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                      );
      }
      else {
        bVar1 = IsVector(&(field->value).type);
        if ((!bVar1) || (bVar1 = true, (field->value).type.element != BASE_TYPE_UTYPE)) {
          bVar2 = IsVector(&(field->value).type);
          bVar1 = false;
          if (bVar2) {
            Type::VectorType(&local_a8,&(field->value).type);
            bVar1 = local_a8.base_type == BASE_TYPE_UNION;
          }
        }
        if (bVar1) {
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,(string *)&(field->value).constant);
        }
        else {
          std::operator+(__return_storage_ptr__,&(field->value).constant,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_70);
        }
      }
    }
  }
  local_84 = 1;
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(suffix.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string GenDefaultBufferValue(const FieldDef &field) const {
    auto &value = field.value;
    auto base_type = value.type.base_type;
    auto field_name = field.name;
    std::string suffix = IsScalar(base_type) ? LiteralSuffix(value.type) : "";
    if (field.IsScalarOptional()) { return "null"; }
    if (IsFloat(base_type)) {
      auto val = KotlinFloatGen.GenFloatConstant(field);
      if (base_type == BASE_TYPE_DOUBLE && val.back() == 'f') {
        val.pop_back();
      }
      return val;
    }

    if (base_type == BASE_TYPE_BOOL) {
      return value.constant == "0" ? "false" : "true";
    }

    if (IsEnum(field.value.type)) {
      return value.constant + suffix;
    } else if ((IsVector(field.value.type) &&
                field.value.type.element == BASE_TYPE_UTYPE) ||
               (IsVector(field.value.type) &&
                field.value.type.VectorType().base_type == BASE_TYPE_UNION)) {
      return value.constant;
    } else {
      return value.constant + suffix;
    }
  }